

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O2

string * __thiscall
duckdb::Time::ToUTCOffset_abi_cxx11_
          (string *__return_storage_ptr__,Time *this,int hour_offset,int minute_offset)

{
  int iVar1;
  long lVar2;
  dtime_t dtime;
  int32_t *piVar3;
  char buffer [6];
  int32_t time_units [4];
  char local_2e;
  char local_2d [2];
  undefined1 local_2b;
  char local_2a [2];
  int32_t local_28;
  int local_24;
  int32_t local_20;
  int32_t local_1c;
  
  iVar1 = (int)this * 0x3c + hour_offset;
  lVar2 = (long)iVar1 * 60000000;
  local_2e = (char)(iVar1 >> 0x1f) * -2 + '+';
  dtime.micros = (long)iVar1 * -60000000;
  if (0 < lVar2) {
    dtime.micros = lVar2;
  }
  Convert(dtime,&local_28,&local_24,&local_20,&local_1c);
  TimeToStringCast::FormatTwoDigits(local_2d,local_28);
  if (local_24 == 0) {
    piVar3 = (int32_t *)&local_2b;
  }
  else {
    piVar3 = &local_28;
    local_2b = 0x3a;
    TimeToStringCast::FormatTwoDigits(local_2a,local_24);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,&local_2e,piVar3);
  return __return_storage_ptr__;
}

Assistant:

string Time::ToUTCOffset(int hour_offset, int minute_offset) {
	dtime_t time((hour_offset * Interval::MINS_PER_HOUR + minute_offset) * Interval::MICROS_PER_MINUTE);

	char buffer[1 + 2 + 1 + 2];
	idx_t length = 0;
	buffer[length++] = (time.micros < 0 ? '-' : '+');
	time.micros = std::abs(time.micros);

	int32_t time_units[4];
	Time::Convert(time, time_units[0], time_units[1], time_units[2], time_units[3]);

	TimeToStringCast::FormatTwoDigits(buffer + length, time_units[0]);
	length += 2;
	if (time_units[1]) {
		buffer[length++] = ':';
		TimeToStringCast::FormatTwoDigits(buffer + length, time_units[1]);
		length += 2;
	}

	return string(buffer, length);
}